

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O3

S2Point * __thiscall S2CellId::ToPoint(S2Point *__return_storage_ptr__,S2CellId *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  S2Point local_28;
  
  ToPointRaw(&local_28,this);
  dVar2 = SQRT(local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0] +
               local_28.c_[2] * local_28.c_[2]);
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  auVar1._8_4_ = SUB84(dVar2 * local_28.c_[1],0);
  auVar1._0_8_ = dVar2 * local_28.c_[0];
  auVar1._12_4_ = (int)((ulong)(dVar2 * local_28.c_[1]) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar1;
  __return_storage_ptr__->c_[2] = dVar2 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point ToPoint() const { return ToPointRaw().Normalize(); }